

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

void __thiscall duckdb::ZSTDCompressionState::~ZSTDCompressionState(ZSTDCompressionState *this)

{
  _Head_base<0UL,_duckdb::ZSTDAnalyzeState_*,_false> _Var1;
  long lVar2;
  
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__ZSTDCompressionState_01976940;
  lVar2 = 0x88;
  do {
    BufferHandle::~BufferHandle((BufferHandle *)((long)this->extra_pages + lVar2 + -0x70));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0x58);
  BufferHandle::~BufferHandle(&this->segment_handle);
  ::std::unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::~unique_ptr
            (&(this->segment).
              super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>);
  _Var1._M_head_impl =
       (this->analyze_state).
       super_unique_ptr<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ZSTDAnalyzeState,_std::default_delete<duckdb::ZSTDAnalyzeState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ZSTDAnalyzeState_*,_std::default_delete<duckdb::ZSTDAnalyzeState>_>
       .super__Head_base<0UL,_duckdb::ZSTDAnalyzeState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ZSTDAnalyzeState *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_AnalyzeState + 8))();
  }
  operator_delete(this);
  return;
}

Assistant:

explicit ZSTDCompressionState(ColumnDataCheckpointData &checkpoint_data,
	                              unique_ptr<ZSTDAnalyzeState> &&analyze_state_p)
	    : CompressionState(analyze_state_p->info), analyze_state(std::move(analyze_state_p)),
	      checkpoint_data(checkpoint_data),
	      partial_block_manager(checkpoint_data.GetCheckpointState().GetPartialBlockManager()),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ZSTD)) {

		total_vector_count = GetVectorCount(analyze_state->count);
		total_segment_count = analyze_state->segment_count;
		vectors_per_segment = analyze_state->vectors_per_segment;

		segment_count = 0;
		vector_count = 0;
		vector_in_segment_count = 0;
		tuple_count = 0;

		idx_t offset = NewSegment();
		SetCurrentBuffer(segment_handle);
		current_buffer_ptr = segment_handle.Ptr() + offset;
		D_ASSERT(GetCurrentOffset() <= GetWritableSpace(info));
	}